

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,ExpressionSyntax **args_5,
          Token *args_6)

{
  Info *pIVar1;
  Info *pIVar2;
  ExpressionSyntax *pEVar3;
  size_type sVar4;
  pointer ppAVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  SyntaxKind SVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  TokenKind TVar27;
  undefined1 uVar28;
  NumericTokenFlags NVar29;
  uint32_t uVar30;
  ExplicitAnsiPortSyntax *pEVar31;
  long lVar32;
  
  pEVar31 = (ExplicitAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExplicitAnsiPortSyntax *)this->endPtr < pEVar31 + 1) {
    pEVar31 = (ExplicitAnsiPortSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pEVar31 + 1);
  }
  TVar11 = args_1->kind;
  uVar12 = args_1->field_0x2;
  NVar13.raw = (args_1->numFlags).raw;
  uVar14 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar15 = args_2->kind;
  uVar16 = args_2->field_0x2;
  NVar17.raw = (args_2->numFlags).raw;
  uVar18 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar19 = args_3->kind;
  uVar20 = args_3->field_0x2;
  NVar21.raw = (args_3->numFlags).raw;
  uVar22 = args_3->rawLen;
  pIVar6 = args_3->info;
  TVar23 = args_4->kind;
  uVar24 = args_4->field_0x2;
  NVar25.raw = (args_4->numFlags).raw;
  uVar26 = args_4->rawLen;
  pIVar7 = args_4->info;
  pEVar3 = *args_5;
  TVar27 = args_6->kind;
  uVar28 = args_6->field_0x2;
  NVar29.raw = (args_6->numFlags).raw;
  uVar30 = args_6->rawLen;
  pIVar8 = args_6->info;
  (pEVar31->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar31->super_MemberSyntax).super_SyntaxNode.kind = ExplicitAnsiPort;
  SVar9 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar10 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar9;
  *(undefined4 *)
   &(pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc =
       uVar10;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar4 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pEVar31->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pEVar31->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar4;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pEVar31->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pEVar31;
  sVar4 = (pEVar31->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar4 != 0) {
    ppAVar5 = (pEVar31->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar32 = 0;
    do {
      **(undefined8 **)((long)ppAVar5 + lVar32) = pEVar31;
      lVar32 = lVar32 + 8;
    } while (sVar4 << 3 != lVar32);
  }
  (pEVar31->direction).kind = TVar11;
  (pEVar31->direction).field_0x2 = uVar12;
  (pEVar31->direction).numFlags = (NumericTokenFlags)NVar13.raw;
  (pEVar31->direction).rawLen = uVar14;
  (pEVar31->direction).info = pIVar1;
  (pEVar31->dot).kind = TVar15;
  (pEVar31->dot).field_0x2 = uVar16;
  (pEVar31->dot).numFlags = (NumericTokenFlags)NVar17.raw;
  (pEVar31->dot).rawLen = uVar18;
  (pEVar31->dot).info = pIVar2;
  (pEVar31->name).kind = TVar19;
  (pEVar31->name).field_0x2 = uVar20;
  (pEVar31->name).numFlags = (NumericTokenFlags)NVar21.raw;
  (pEVar31->name).rawLen = uVar22;
  (pEVar31->name).info = pIVar6;
  (pEVar31->openParen).kind = TVar23;
  (pEVar31->openParen).field_0x2 = uVar24;
  (pEVar31->openParen).numFlags = (NumericTokenFlags)NVar25.raw;
  (pEVar31->openParen).rawLen = uVar26;
  (pEVar31->openParen).info = pIVar7;
  pEVar31->expr = pEVar3;
  (pEVar31->closeParen).kind = TVar27;
  (pEVar31->closeParen).field_0x2 = uVar28;
  (pEVar31->closeParen).numFlags = (NumericTokenFlags)NVar29.raw;
  (pEVar31->closeParen).rawLen = uVar30;
  (pEVar31->closeParen).info = pIVar8;
  if (pEVar3 != (ExpressionSyntax *)0x0) {
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)pEVar31;
  }
  return pEVar31;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }